

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O3

ScalarFunction * duckdb::ConcatWsFun::GetFunction(void)

{
  LogicalType varargs;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bind_scalar_function_t *pp_Var3;
  ScalarFunction *in_RDI;
  bind_scalar_function_t *pp_Var4;
  long lVar5;
  scalar_function_t *__x;
  byte bVar6;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde4;
  FunctionNullHandling in_stack_fffffffffffffdf0;
  bind_lambda_function_t in_stack_fffffffffffffdf8;
  scalar_function_t local_200;
  LogicalType local_1e0;
  LogicalType local_1c8 [2];
  vector<duckdb::LogicalType,_true> local_198;
  string local_180;
  LogicalType local_160;
  ScalarFunction local_148;
  
  bVar6 = 0;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"concat_ws","");
  LogicalType::LogicalType(local_1c8,VARCHAR);
  LogicalType::LogicalType(local_1c8 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_1c8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198,__l,
             (allocator_type *)&stack0xfffffffffffffdff);
  LogicalType::LogicalType(&local_1e0,VARCHAR);
  local_200.super__Function_base._M_functor._8_8_ = 0;
  local_200.super__Function_base._M_functor._M_unused._M_object = ConcatWSFunction;
  local_200._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_200.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_160,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_160;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffddc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffde4;
  ScalarFunction::ScalarFunction
            (&local_148,&local_180,&local_198,&local_1e0,&local_200,BindConcatWSFunction,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8);
  LogicalType::~LogicalType(&local_160);
  if (local_200.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_200.super__Function_base._M_manager)
              ((_Any_data *)&local_200,(_Any_data *)&local_200,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_1e0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198);
  lVar5 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_1c8[0].id_ + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  LogicalType::LogicalType(local_1c8,ANY);
  _Var2._M_pi = local_148.super_BaseScalarFunction.super_SimpleFunction.varargs.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar1 = local_148.super_BaseScalarFunction.super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148.super_BaseScalarFunction.super_SimpleFunction.varargs.id_ = local_1c8[0].id_;
  local_148.super_BaseScalarFunction.super_SimpleFunction.varargs.physical_type_ =
       local_1c8[0].physical_type_;
  local_148.super_BaseScalarFunction.super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1c8[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148.super_BaseScalarFunction.super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1c8[0].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_1c8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_1c8[0].type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  LogicalType::~LogicalType(local_1c8);
  local_148.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  SimpleFunction::SimpleFunction((SimpleFunction *)in_RDI,(SimpleFunction *)&local_148);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::LogicalType
            (&(in_RDI->super_BaseScalarFunction).return_type,
             &local_148.super_BaseScalarFunction.return_type);
  (in_RDI->super_BaseScalarFunction).stability = local_148.super_BaseScalarFunction.stability;
  (in_RDI->super_BaseScalarFunction).null_handling =
       local_148.super_BaseScalarFunction.null_handling;
  (in_RDI->super_BaseScalarFunction).errors = local_148.super_BaseScalarFunction.errors;
  (in_RDI->super_BaseScalarFunction).collation_handling =
       local_148.super_BaseScalarFunction.collation_handling;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  __x = &local_148.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (&in_RDI->function,__x);
  pp_Var3 = &local_148.bind;
  pp_Var4 = &in_RDI->bind;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pp_Var4 = *pp_Var3;
    pp_Var3 = pp_Var3 + (ulong)bVar6 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar6 * -2 + 1;
  }
  (in_RDI->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_148.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_148.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_01963628;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_148.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_148.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
      local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_01963628;
      if (local_148.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_009de41f;
    }
    else {
      (local_148.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_148.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
    local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_01963628;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_009de41f:
  if (local_148.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.function.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

ScalarFunction ConcatWsFun::GetFunction() {
	// concat_ws functions similarly to the concat function, except the result is NULL if the separator is NULL
	// if the separator is not NULL, however, NULL values are counted as empty string
	// there is one separate rule: there are no separators added between NULL values,
	// so the NULL value and empty string are different!
	// e.g.:
	// concat_ws(',', NULL, NULL) = ""
	// concat_ws(',', '', '') = ","

	ScalarFunction concat_ws = ScalarFunction("concat_ws", {LogicalType::VARCHAR, LogicalType::ANY},
	                                          LogicalType::VARCHAR, ConcatWSFunction, BindConcatWSFunction);
	concat_ws.varargs = LogicalType::ANY;
	concat_ws.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return ScalarFunction(concat_ws);
}